

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::setEBDirichlet(MLEBABecLap *this,int amrlev,MultiFab *phi,MultiFab *beta)

{
  undefined8 uVar1;
  Location LVar2;
  BoxArray *bxs;
  DistributionMapping *dm;
  FabFactory<amrex::FArrayBox> *pFVar3;
  pointer puVar4;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar5;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> _Var6;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Var7;
  uint ncomp;
  FabType FVar8;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var9;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_00;
  pointer *ppbVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint32_t *puVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  Periodicity PVar25;
  MFIter mfi;
  MFItInfo mfi_info;
  long local_2a0;
  long local_298;
  ulong local_290;
  ulong local_278;
  Box local_24c;
  long local_230;
  FabArray<amrex::EBCellFlagFab> *local_228;
  long local_220;
  ulong local_218;
  uint local_20c;
  FabArray<amrex::FArrayBox> *local_208;
  MLEBABecLap *local_200;
  Array4<double> local_1f8;
  Array4<double> local_1b8;
  undefined1 local_178 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  int local_150;
  Vector<int,_std::allocator<int>_> *local_138;
  FabArray<amrex::FArrayBox> *local_110;
  Array4<const_double> local_108;
  Array4<const_double> local_c8;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_208 = &phi->super_FabArray<amrex::FArrayBox>;
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_20c = (beta->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  LVar2 = this->m_phi_loc;
  local_110 = &beta->super_FabArray<amrex::FArrayBox>;
  if (local_20c != ncomp && local_20c != 1) {
    Assert_host("beta_ncomp == 1 || beta_ncomp == ncomp",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
                ,0xc0,(char *)0x0);
  }
  lVar20 = (long)amrlev;
  local_220 = lVar20;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar20]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    bxs = *(BoxArray **)
           &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
            super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            .
            super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar20].
            super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
            super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
    dm = *(DistributionMapping **)
          &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar20].
           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
    ;
    local_178._1_7_ = 0;
    local_178[0] = true;
    local_178._8_4_ = 0;
    local_178._12_4_ = 0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar3 = (FabFactory<amrex::FArrayBox> *)
             **(undefined8 **)
               &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar20].
                super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                .
                super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    _Var9.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
         operator_new(0x180);
    MultiFab::MultiFab((MultiFab *)
                       _Var9.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm,ncomp,
                       (uint)(LVar2 == CellCentroid),(MFInfo *)local_178,pFVar3);
    lVar20 = local_220;
    puVar4 = (this->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar5.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar4[local_220]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar4[local_220]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         _Var9.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    if (tVar5.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar5.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168);
  }
  local_230 = lVar20 * 3;
  lVar17 = lVar20;
  local_200 = this;
  if ((**(long **)&(this->m_eb_b_coeffs).
                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar20].
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       == 0) &&
     (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
          super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar20])) {
    local_298 = 0;
    lVar15 = 0;
    lVar21 = 0;
    do {
      lVar17 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].
                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>;
      lVar12 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar20].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
      ;
      local_178._1_7_ = 0;
      local_178[0] = true;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178._8_4_ = 0;
      local_178._12_4_ = 0;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pFVar3 = *(FabFactory<amrex::FArrayBox> **)
                (*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar20].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                + lVar21 * 8);
      this_00._M_t.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
      _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
           operator_new(0x180);
      MultiFab::MultiFab((MultiFab *)
                         this_00._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                         (BoxArray *)(lVar17 + lVar15),(DistributionMapping *)(lVar12 + local_298),
                         ncomp,0,(MFInfo *)local_178,pFVar3);
      this = local_200;
      puVar4 = (&(((local_200->m_eb_b_coeffs).
                   super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ).
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)[local_230];
      _Var6._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           *(tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)&puVar4[lVar21]._M_t;
      puVar4[lVar21]._M_t =
           this_00._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if ((__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)
          _Var6._M_t.
          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
          super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)0x0) {
        (**(code **)(*(long *)_Var6._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_168);
      lVar21 = lVar21 + 1;
      lVar15 = lVar15 + 0x68;
      local_298 = local_298 + 0x10;
      lVar17 = local_220;
    } while (lVar21 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                      super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[local_220]);
  }
  _Var7._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       *(tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         *)&(&(((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
              ).
              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)[local_230]->_M_t;
  if ((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       )_Var7._M_t.
        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
       )0x0) {
    lVar20 = 0;
  }
  else {
    lVar20 = __dynamic_cast(_Var7._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar20 == 0) {
    local_228 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_228 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar20 + 0xd8));
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_00753ec0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_178,&local_208->super_FabArrayBase,&local_44);
  if ((int)local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_150) {
    local_218 = (ulong)ncomp;
    do {
      MFIter::tilebox(&local_24c,(MFIter *)local_178);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1b8,
                 (FabArray<amrex::FArrayBox> *)
                 (this->m_eb_phi).
                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MFIter *)local_178);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1f8,
                 (FabArray<amrex::FArrayBox> *)
                 (&(((this->m_eb_b_coeffs).
                     super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ).
                   super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)[local_230]->_M_t,(MFIter *)local_178);
      if (local_228 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_0060ab79:
        if (0 < (int)ncomp) {
          lVar20 = (long)local_24c.smallend.vect[1];
          local_2a0 = 0;
          uVar11 = 0;
          do {
            iVar19 = local_24c.smallend.vect[2];
            if (local_24c.smallend.vect[2] <= local_24c.bigend.vect[2]) {
              do {
                if (local_24c.smallend.vect[1] <= local_24c.bigend.vect[1]) {
                  lVar15 = (long)local_1f8.p +
                           local_1f8.nstride * local_2a0 +
                           (lVar20 - local_1f8.begin.y) * local_1f8.jstride * 8 +
                           ((long)iVar19 - (long)local_1f8.begin.z) * local_1f8.kstride * 8 +
                           (long)local_1f8.begin.x * -8 + (long)local_24c.smallend.vect[0] * 8;
                  lVar21 = (long)local_1b8.p +
                           local_1b8.nstride * local_2a0 +
                           (lVar20 - local_1b8.begin.y) * local_1b8.jstride * 8 +
                           ((long)iVar19 - (long)local_1b8.begin.z) * local_1b8.kstride * 8 +
                           (long)local_1b8.begin.x * -8 + (long)local_24c.smallend.vect[0] * 8;
                  lVar17 = lVar20;
                  do {
                    if (local_24c.smallend.vect[0] <= local_24c.bigend.vect[0]) {
                      lVar12 = 0;
                      do {
                        *(undefined8 *)(lVar21 + lVar12 * 8) = 0;
                        *(undefined8 *)(lVar15 + lVar12 * 8) = 0;
                        lVar12 = lVar12 + 1;
                      } while ((local_24c.bigend.vect[0] - local_24c.smallend.vect[0]) + 1 !=
                               (int)lVar12);
                    }
                    lVar17 = lVar17 + 1;
                    lVar15 = lVar15 + local_1f8.jstride * 8;
                    lVar21 = lVar21 + local_1b8.jstride * 8;
                  } while (local_24c.bigend.vect[1] + 1 != (int)lVar17);
                }
                bVar22 = iVar19 != local_24c.bigend.vect[2];
                iVar19 = iVar19 + 1;
              } while (bVar22);
            }
            uVar11 = uVar11 + 1;
            local_2a0 = local_2a0 + 8;
          } while (uVar11 != local_218);
        }
      }
      else {
        ppbVar10 = &local_168.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_138 != (Vector<int,_std::allocator<int>_> *)0x0) {
          ppbVar10 = (pointer *)
                     ((local_138->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start +
                     (int)local_168.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        FVar8 = EBCellFlagFab::getType
                          ((local_228->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar10],&local_24c);
        if ((uint)(FVar8 + singlevalued) < 2) goto LAB_0060ab79;
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_108,local_208,(MFIter *)local_178);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_c8,local_110,(MFIter *)local_178);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_88,local_228,(MFIter *)local_178);
        if (local_20c == ncomp) {
          if (0 < (int)ncomp) {
            lVar17 = (long)local_24c.smallend.vect[0];
            lVar20 = lVar17 * 8;
            lVar15 = 0;
            local_290 = 0;
            do {
              iVar19 = local_24c.smallend.vect[2];
              if (local_24c.smallend.vect[2] <= local_24c.bigend.vect[2]) {
                do {
                  if (local_24c.smallend.vect[1] <= local_24c.bigend.vect[1]) {
                    lVar12 = (long)iVar19;
                    puVar18 = (uint32_t *)
                              ((long)&local_88.p
                                      [lVar17 + ((lVar12 - local_88.begin.z) * local_88.kstride -
                                                (long)local_88.begin.x)].flag +
                              ((long)local_24c.smallend.vect[1] - (long)local_88.begin.y) *
                              local_88.jstride * 4);
                    lVar21 = (long)local_24c.smallend.vect[1];
                    do {
                      if (local_24c.smallend.vect[0] <= local_24c.bigend.vect[0]) {
                        lVar14 = local_1b8.nstride * lVar15 +
                                 (lVar12 - local_1b8.begin.z) * local_1b8.kstride * 8 +
                                 (lVar21 - local_1b8.begin.y) * local_1b8.jstride * 8 +
                                 (long)local_1b8.begin.x * -8 + lVar20;
                        lVar13 = 0;
                        lVar16 = lVar17;
                        do {
                          if ((puVar18[lVar13] & 3) == 1) {
                            *(undefined8 *)((long)local_1b8.p + lVar13 * 8 + lVar14) =
                                 *(undefined8 *)
                                  ((long)local_108.p +
                                  lVar13 * 8 +
                                  local_108.nstride * lVar15 +
                                  (lVar12 - local_108.begin.z) * local_108.kstride * 8 +
                                  (lVar21 - local_108.begin.y) * local_108.jstride * 8 +
                                  (long)local_108.begin.x * -8 + lVar20);
                            uVar1 = *(undefined8 *)
                                     ((long)local_c8.p +
                                     lVar13 * 8 +
                                     local_c8.nstride * lVar15 +
                                     (lVar12 - local_c8.begin.z) * local_c8.kstride * 8 +
                                     (lVar21 - local_c8.begin.y) * local_c8.jstride * 8 +
                                     (long)local_c8.begin.x * -8 + lVar20);
                            uVar23 = (undefined4)uVar1;
                            uVar24 = (undefined4)((ulong)uVar1 >> 0x20);
                          }
                          else {
                            *(undefined8 *)((long)local_1b8.p + lVar13 * 8 + lVar14) = 0;
                            uVar23 = 0;
                            uVar24 = 0;
                          }
                          local_1f8.p
                          [(lVar21 - local_1f8.begin.y) * local_1f8.jstride +
                           (lVar12 - local_1f8.begin.z) * local_1f8.kstride +
                           local_1f8.nstride * local_290 + (lVar16 - local_1f8.begin.x)] =
                               (double)CONCAT44(uVar24,uVar23);
                          lVar16 = lVar16 + 1;
                          lVar13 = lVar13 + 1;
                        } while ((local_24c.bigend.vect[0] - local_24c.smallend.vect[0]) + 1 !=
                                 (int)lVar13);
                      }
                      lVar21 = lVar21 + 1;
                      puVar18 = puVar18 + local_88.jstride;
                    } while (local_24c.bigend.vect[1] + 1 != (int)lVar21);
                  }
                  bVar22 = iVar19 != local_24c.bigend.vect[2];
                  iVar19 = iVar19 + 1;
                } while (bVar22);
              }
              local_290 = local_290 + 1;
              lVar15 = lVar15 + 8;
            } while (local_290 != local_218);
          }
        }
        else if (0 < (int)ncomp) {
          lVar20 = (long)local_24c.smallend.vect[0];
          local_290 = 0;
          local_278 = 0;
          do {
            iVar19 = local_24c.smallend.vect[2];
            if (local_24c.smallend.vect[2] <= local_24c.bigend.vect[2]) {
              do {
                if (local_24c.smallend.vect[1] <= local_24c.bigend.vect[1]) {
                  lVar15 = (long)iVar19;
                  puVar18 = (uint32_t *)
                            ((long)&local_88.p
                                    [lVar20 + ((lVar15 - local_88.begin.z) * local_88.kstride -
                                              (long)local_88.begin.x)].flag +
                            ((long)local_24c.smallend.vect[1] - (long)local_88.begin.y) *
                            local_88.jstride * 4);
                  lVar17 = (long)local_24c.smallend.vect[1];
                  do {
                    if (local_24c.smallend.vect[0] <= local_24c.bigend.vect[0]) {
                      lVar21 = local_1b8.nstride * local_290 +
                               (lVar15 - local_1b8.begin.z) * local_1b8.kstride * 8 +
                               (lVar17 - local_1b8.begin.y) * local_1b8.jstride * 8 +
                               (long)local_1b8.begin.x * -8 + lVar20 * 8;
                      lVar14 = 0;
                      lVar12 = lVar20;
                      do {
                        if ((puVar18[lVar14] & 3) == 1) {
                          *(undefined8 *)((long)local_1b8.p + lVar14 * 8 + lVar21) =
                               *(undefined8 *)
                                ((long)local_108.p +
                                lVar14 * 8 +
                                local_108.nstride * local_290 +
                                (lVar15 - local_108.begin.z) * local_108.kstride * 8 +
                                (lVar17 - local_108.begin.y) * local_108.jstride * 8 +
                                (long)local_108.begin.x * -8 + lVar20 * 8);
                          uVar23 = SUB84(local_c8.p
                                         [lVar20 + (((lVar17 - local_c8.begin.y) * local_c8.jstride
                                                    + (lVar15 - local_c8.begin.z) * local_c8.kstride
                                                      + lVar14) - (long)local_c8.begin.x)],0);
                          uVar24 = (undefined4)
                                   ((ulong)local_c8.p
                                           [lVar20 + (((lVar17 - local_c8.begin.y) *
                                                       local_c8.jstride +
                                                      (lVar15 - local_c8.begin.z) * local_c8.kstride
                                                      + lVar14) - (long)local_c8.begin.x)] >> 0x20);
                        }
                        else {
                          *(undefined8 *)((long)local_1b8.p + lVar14 * 8 + lVar21) = 0;
                          uVar23 = 0;
                          uVar24 = 0;
                        }
                        local_1f8.p
                        [(lVar17 - local_1f8.begin.y) * local_1f8.jstride +
                         (lVar15 - local_1f8.begin.z) * local_1f8.kstride +
                         local_1f8.nstride * local_278 + (lVar12 - local_1f8.begin.x)] =
                             (double)CONCAT44(uVar24,uVar23);
                        lVar12 = lVar12 + 1;
                        lVar14 = lVar14 + 1;
                      } while ((local_24c.bigend.vect[0] - local_24c.smallend.vect[0]) + 1 !=
                               (int)lVar14);
                    }
                    lVar17 = lVar17 + 1;
                    puVar18 = puVar18 + local_88.jstride;
                  } while (local_24c.bigend.vect[1] + 1 != (int)lVar17);
                }
                bVar22 = iVar19 != local_24c.bigend.vect[2];
                iVar19 = iVar19 + 1;
              } while (bVar22);
            }
            local_278 = local_278 + 1;
            local_290 = local_290 + 8;
          } while (local_278 != local_218);
        }
      }
      MFIter::operator++((MFIter *)local_178);
      lVar17 = local_220;
      this = local_200;
    } while ((int)local_168.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_150);
  }
  MFIter::~MFIter((MFIter *)local_178);
  if (LVar2 == CellCentroid) {
    _Var9.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->m_eb_phi).
         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar17]._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    PVar25 = Geometry::periodicity
                       ((&(((this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start)[local_230]);
    local_178[0] = PVar25.period.vect[0]._0_1_;
    local_178._1_7_ = PVar25.period.vect._1_7_;
    local_178._8_4_ = PVar25.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              ((FabArray<amrex::FArrayBox> *)
               _Var9.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               (Periodicity *)local_178,false);
  }
  return;
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, const MultiFab& beta)
{
    const int ncomp = getNComp();
    const int beta_ncomp = beta.nComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    AMREX_ALWAYS_ASSERT(beta_ncomp == 1 || beta_ncomp == ncomp);

    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            Array4<Real const> const& betain = beta.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            if (beta_ncomp == ncomp) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        phiout(i,j,k,n) = phiin(i,j,k,n);
                        betaout(i,j,k,n) = betain(i,j,k,n);
                    } else {
                        phiout(i,j,k,n) = 0.0;
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
                {
                    if (flag(i,j,k).isSingleValued()) {
                        phiout(i,j,k,n) = phiin(i,j,k,n);
                        betaout(i,j,k,n) = betain(i,j,k,0);
                    } else {
                        phiout(i,j,k,n) = 0.0;
                        betaout(i,j,k,n) = 0.0;
                    }
                });
            }
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}